

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_base_size
          (CompilerGLSL *this,SPIRType *type,BufferPackingStandard param_2)

{
  CompilerError *this_00;
  allocator local_49;
  string local_48 [36];
  BufferPackingStandard local_24;
  SPIRType *pSStack_20;
  BufferPackingStandard param_2_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  switch(*(undefined4 *)&(type->super_IVariant).field_0xc) {
  case 3:
  case 4:
    this_local._4_4_ = 1;
    break;
  case 5:
  case 6:
  case 0xc:
    this_local._4_4_ = 2;
    break;
  case 7:
  case 8:
  case 0xd:
    this_local._4_4_ = 4;
    break;
  case 9:
  case 10:
  case 0xe:
    this_local._4_4_ = 8;
    break;
  default:
    local_24 = param_2;
    pSStack_20 = type;
    type_local = (SPIRType *)this;
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,"Unrecognized type in type_to_packed_base_size.",&local_49);
    CompilerError::CompilerError(this_00,(string *)local_48);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_base_size(const SPIRType &type, BufferPackingStandard)
{
	switch (type.basetype)
	{
	case SPIRType::Double:
	case SPIRType::Int64:
	case SPIRType::UInt64:
		return 8;
	case SPIRType::Float:
	case SPIRType::Int:
	case SPIRType::UInt:
		return 4;
	case SPIRType::Half:
	case SPIRType::Short:
	case SPIRType::UShort:
		return 2;
	case SPIRType::SByte:
	case SPIRType::UByte:
		return 1;

	default:
		SPIRV_CROSS_THROW("Unrecognized type in type_to_packed_base_size.");
	}
}